

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue JS_NewAtomString(JSContext *ctx,char *str)

{
  JSAtom atom;
  JSValue JVar1;
  
  atom = JS_NewAtom(ctx,str);
  if (atom == 0) {
    JVar1 = (JSValue)(ZEXT816(6) << 0x40);
  }
  else {
    JVar1 = JS_AtomToString(ctx,atom);
    JS_FreeAtom(ctx,atom);
  }
  return JVar1;
}

Assistant:

JSValue JS_NewAtomString(JSContext *ctx, const char *str)
{
    JSAtom atom = JS_NewAtom(ctx, str);
    if (atom == JS_ATOM_NULL)
        return JS_EXCEPTION;
    JSValue val = JS_AtomToString(ctx, atom);
    JS_FreeAtom(ctx, atom);
    return val;
}